

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcapture(bifcxdef *ctx,int argc)

{
  long lVar1;
  uint uVar2;
  undefined8 *in_RDI;
  errdef fr_;
  uchar *p;
  uint ofs;
  uint siz;
  mcmon obj;
  mcmcxdef *mcx;
  undefined4 in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe7c;
  mcmon in_stack_fffffffffffffe7e;
  int in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  mcmon in_stack_fffffffffffffe86;
  int len;
  long in_stack_fffffffffffffe88;
  mcmcxdef *ctx_00;
  undefined4 in_stack_fffffffffffffe90;
  undefined8 local_168;
  int local_160;
  __jmp_buf_tag _Stack_f8;
  uchar *local_30;
  uint local_24;
  uint local_20;
  mcmon local_1a;
  undefined8 local_18;
  undefined8 *local_8;
  
  local_18 = *(undefined8 *)(in_RDI[1] + 8);
  uVar2 = (uint)*(byte *)(*(long *)(in_RDI[1] + 0x20) + -0x10);
  local_8 = in_RDI;
  if (uVar2 == 1) {
    lVar1 = *(long *)(in_RDI[1] + 0x20);
    *(long *)(in_RDI[1] + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(**(long **)in_RDI[1] + 0x68) = 0;
      runsign((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe86,
                       CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
              CONCAT22(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe7c));
    }
    ctx_00 = *(mcmcxdef **)(*(long *)(in_RDI[1] + 0x20) + 8);
    local_24 = (uint)ctx_00;
    local_1a = tiogetcapture((tiocxdef *)in_RDI[2]);
    local_20 = tiocapturesize((tiocxdef *)local_8[2]);
    if (local_1a == 0xffff) {
      runpnil((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe86,
                       CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)));
    }
    else {
      if (local_24 == 0) {
        tiocapture((tiocxdef *)
                   CONCAT26(in_stack_fffffffffffffe86,
                            CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
                   (mcmcxdef *)
                   CONCAT26(in_stack_fffffffffffffe7e,
                            CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),0);
        tioclrcapture((tiocxdef *)local_8[2]);
      }
      local_30 = mcmlck(ctx_00,in_stack_fffffffffffffe86);
      local_30 = local_30 + local_24;
      if (local_20 < local_24) {
        local_20 = 0;
      }
      else {
        local_20 = local_20 - local_24;
      }
      len = local_20;
      local_160 = _setjmp(&_Stack_f8);
      if (local_160 != 0) {
        *(undefined8 *)*local_8 = local_168;
        mcmunlck((mcmcxdef *)
                 CONCAT26((short)((uint)len >> 0x10),CONCAT24((short)len,in_stack_fffffffffffffe80))
                 ,in_stack_fffffffffffffe7e);
        errrse1((errcxdef *)
                CONCAT26((short)((uint)len >> 0x10),CONCAT24((short)len,in_stack_fffffffffffffe80)),
                (errdef *)
                CONCAT26(in_stack_fffffffffffffe7e,
                         CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)));
      }
      local_168 = *(undefined8 *)*local_8;
      *(undefined8 **)*local_8 = &local_168;
      runpstr((runcxdef *)CONCAT44(uVar2,in_stack_fffffffffffffe90),(char *)ctx_00,len,
              in_stack_fffffffffffffe80);
      *(undefined8 *)*local_8 = local_168;
      mcmunlck((mcmcxdef *)
               CONCAT26((short)((uint)len >> 0x10),CONCAT24((short)len,in_stack_fffffffffffffe80)),
               in_stack_fffffffffffffe7e);
    }
  }
  else {
    if (uVar2 != 8) {
      *(char **)(**(long **)in_RDI[1] + 0x18) = "outcapture";
      *(undefined4 *)(**(long **)in_RDI[1] + 0x68) = 1;
      runsign((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe86,
                       CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
              CONCAT22(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe7c));
    }
    tiocapture((tiocxdef *)
               CONCAT26(in_stack_fffffffffffffe86,
                        CONCAT24(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
               (mcmcxdef *)
               CONCAT26(in_stack_fffffffffffffe7e,
                        CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),0);
    local_20 = tiocapturesize((tiocxdef *)local_8[2]);
    runpnum((runcxdef *)CONCAT44(uVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  }
  return;
}

Assistant:

void bifcapture(bifcxdef *ctx, int argc)
{
    mcmcxdef *mcx = ctx->bifcxrun->runcxmem;
    mcmon     obj;
    uint      siz;
    uint      ofs;
    uchar    *p;

    /* get the capture on/off flag */
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_TRUE:
        /* turn on capturing */
        tiocapture(ctx->bifcxtio, mcx, TRUE);

        /*
         *   The return value is a status code used to restore the
         *   original status on the bracketing call to turn off output.
         *   The only status necessary is the current output size. 
         */
        siz = tiocapturesize(ctx->bifcxtio);
        runpnum(ctx->bifcxrun, (long)siz);
        break;

    case DAT_NUMBER:
        /* get the original offset */
        ofs = runpopnum(ctx->bifcxrun);

        /* get the capture object and size */
        obj = tiogetcapture(ctx->bifcxtio);
        siz = tiocapturesize(ctx->bifcxtio);
        if (obj == MCMONINV)
        {
            runpnil(ctx->bifcxrun);
            return;
        }

        /* turn off capturing and reset the buffer on the outermost call */
        if (ofs == 0)
        {
            tiocapture(ctx->bifcxtio, mcx, FALSE);
            tioclrcapture(ctx->bifcxtio);
        }

        /* lock the object */
        p = mcmlck(mcx, obj);

        /* include only the part that happened after the matching call */
        p += ofs;
        siz = (ofs > siz) ? 0 : siz - ofs;

        ERRBEGIN(ctx->bifcxerr)

        /* push the string onto the stack */
        runpstr(ctx->bifcxrun, (char *)p, siz, 0);
        
        ERRCLEAN(ctx->bifcxerr)
            /* done with the object - unlock it */
            mcmunlck(mcx, obj);
        ERRENDCLN(ctx->bifcxerr)

        /* done with the object - unlock it */
        mcmunlck(mcx, obj);
        break;

    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "outcapture");
    }
}